

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_matchers.hpp
# Opt level: O0

int __thiscall
Catch::Matchers::Impl::
MatcherImpl<Catch::Matchers::Impl::Generic::AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::clone(MatcherImpl<Catch::Matchers::Impl::Generic::AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  MatcherImpl<Catch::Matchers::Impl::Generic::AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this_00 = (AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x28);
  Generic::AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  AllOf(this_00,(AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)__fn);
  Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Ptr((Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)this,(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
  return (int)this;
}

Assistant:

virtual Ptr<Matcher<ExpressionT> > clone() const {
            return Ptr<Matcher<ExpressionT> >( new DerivedT( static_cast<DerivedT const&>( *this ) ) );
        }